

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multihash.cpp
# Opt level: O2

tuple<unsigned_int,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
binary::uvarint_abi_cxx11_
          (tuple<unsigned_int,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,binary *this,Bytes *buf)

{
  undefined1 *puVar1;
  allocator_type local_39;
  uint local_38;
  uint local_34;
  vector<unsigned_char,std::allocator<unsigned_char>> local_30 [24];
  
  binUvarint((binary *)&local_38,(Bytes *)this);
  if ((ulong)local_38 == 0) {
    puVar1 = multihash::errVarIntBufferTooShort_abi_cxx11_;
  }
  else {
    if (-1 < (int)local_38) {
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      vector<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                (local_30,(uchar *)((ulong)local_38 + *(long *)this),
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )*(uchar **)(this + 8),&local_39);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,local_30);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
      *(bool *)((long)&(__return_storage_ptr__->
                       super__Tuple_impl<0UL,_unsigned_int,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ).
                       super__Tuple_impl<1UL,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<1UL,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                       ._M_head_impl.
                       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                       ._M_payload.
                       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
               + 0x20) = false;
      (__return_storage_ptr__->
      super__Tuple_impl<0UL,_unsigned_int,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ).super__Head_base<0UL,_unsigned_int,_false>._M_head_impl = local_34;
      return __return_storage_ptr__;
    }
    puVar1 = multihash::errVarIntTooLong_abi_cxx11_;
  }
  std::_Optional_payload_base<std::__cxx11::string>::
  _Optional_payload_base<std::__cxx11::string_const&>
            ((_Optional_payload_base<std::__cxx11::string> *)__return_storage_ptr__,puVar1);
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_unsigned_int,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ).super__Head_base<0UL,_unsigned_int,_false>._M_head_impl = 0;
  return __return_storage_ptr__;
}

Assistant:

std::tuple<UInt, OptError> uvarint(Bytes &buf) {
	auto [n, c] = binUvarint(buf);
	if (c == 0) {
		return {0, errVarIntBufferTooShort};
	}
	if (c < 0) {
		return {0, errVarIntTooLong};
	}
	buf = Bytes{buf.begin() + c, buf.end()};
	return {n, std::nullopt};
}